

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2_debug_state.c
# Opt level: O1

void append_chunk(h2o_mem_pool_t *pool,h2o_iovec_vector_t *chunks,char *fmt,...)

{
  h2o_iovec_t *phVar1;
  size_t sVar2;
  char in_AL;
  int iVar3;
  char *__s;
  undefined8 in_RCX;
  ulong new_capacity;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &args[0].overflow_arg_area;
  local_108 = 0x3000000018;
  local_f8 = local_e8;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar3 = vsnprintf((char *)0x0,0,fmt,&local_108);
  if (0 < iVar3) {
    __s = (char *)h2o_mem_alloc_pool(pool,(ulong)(iVar3 + 1));
    local_108 = 0x3000000018;
    local_100 = &args[0].overflow_arg_area;
    local_f8 = local_e8;
    iVar3 = vsnprintf(__s,(ulong)(iVar3 + 1),fmt,&local_108);
    new_capacity = chunks->size + 1;
    if (chunks->capacity < new_capacity) {
      h2o_vector__expand(pool,(h2o_vector_t *)chunks,0x10,new_capacity);
    }
    phVar1 = chunks->entries;
    sVar2 = chunks->size;
    chunks->size = sVar2 + 1;
    phVar1[sVar2].base = __s;
    phVar1[sVar2].len = (long)iVar3;
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/http2/http2_debug_state.c"
                ,0x4a,"void append_chunk(h2o_mem_pool_t *, h2o_iovec_vector_t *, const char *, ...)"
               );
}

Assistant:

__attribute__((format(printf, 3, 4))) static void append_chunk(h2o_mem_pool_t *pool, h2o_iovec_vector_t *chunks, const char *fmt,
                                                               ...)
{
    va_list args;

    va_start(args, fmt);
    int size = vsnprintf(NULL, 0, fmt, args);
    va_end(args);

    assert(size > 0);

    h2o_iovec_t v;
    v.base = h2o_mem_alloc_pool(pool, size + 1);

    va_start(args, fmt);
    v.len = vsnprintf(v.base, size + 1, fmt, args);
    va_end(args);

    h2o_vector_reserve(pool, chunks, chunks->size + 1);
    chunks->entries[chunks->size++] = v;
}